

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.h
# Opt level: O2

CopyConst<const_char,_ElementType<1UL>_> * __thiscall
absl::container_internal::internal_layout::
LayoutImpl<std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<Vector3<double>,int,std::less<Vector3<double>>,std::allocator<std::pair<Vector3<double>const,int>>,256,false>>*,unsigned_char,absl::container_internal::slot_type<Vector3<double>,int>,gtl::internal_btree::btree_node<gtl::internal_btree::map_params<Vector3<double>,int,std::less<Vector3<double>>,std::allocator<std::pair<Vector3<double>const,int>>,256,false>>*>,absl::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul>,absl::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul>>
::Pointer<1ul,char_const>
          (LayoutImpl<std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<Vector3<double>,int,std::less<Vector3<double>>,std::allocator<std::pair<Vector3<double>const,int>>,256,false>>*,unsigned_char,absl::container_internal::slot_type<Vector3<double>,int>,gtl::internal_btree::btree_node<gtl::internal_btree::map_params<Vector3<double>,int,std::less<Vector3<double>>,std::allocator<std::pair<Vector3<double>const,int>>,256,false>>*>,absl::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul>,absl::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul>>
           *this,char *p)

{
  if (((ulong)p & 7) == 0) {
    return (CopyConst<const_char,_ElementType<1UL>_> *)(p + *(long *)this * 8);
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/internal/layout.h"
                ,0x1e1,
                "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<Vector3<double>, int, std::less<Vector3<double>>, std::allocator<std::pair<const Vector3<double>, int>>, 256, false>> *, unsigned char, absl::container_internal::slot_type<Vector3<double>, int>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<Vector3<double>, int, std::less<Vector3<double>>, std::allocator<std::pair<const Vector3<double>, int>>, 256, false>> *>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<Vector3<double>, int, std::less<Vector3<double>>, std::allocator<std::pair<const Vector3<double>, int>>, 256, false>> *, unsigned char, absl::container_internal::slot_type<Vector3<double>, int>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<Vector3<double>, int, std::less<Vector3<double>>, std::allocator<std::pair<const Vector3<double>, int>>, 256, false>> *>, SizeSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
               );
}

Assistant:

CopyConst<Char, ElementType<N>>* Pointer(Char* p) const {
    using C = typename std::remove_const<Char>::type;
    static_assert(
        std::is_same<C, char>() || std::is_same<C, unsigned char>() ||
            std::is_same<C, signed char>(),
        "The argument must be a pointer to [const] [signed|unsigned] char");
    // Use a named variable to work around b/33479323.
    constexpr size_t alignment = Alignment();
    (void)alignment;
    assert(reinterpret_cast<uintptr_t>(p) % alignment == 0);
    return reinterpret_cast<CopyConst<Char, ElementType<N>>*>(p + Offset<N>());
  }